

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19404::AckermannTask::provideValue
          (AckermannTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,ValueType *value)

{
  TaskInterface local_48;
  KeyType local_38;
  int local_18;
  int local_14;
  
  local_48.ctx = ti.ctx;
  local_48.impl = ti.impl;
  if (inputID == 1) {
    AckermannValue::AckermannValue((AckermannValue *)&local_38,value);
    (this->recursiveResultB).value = (int)local_38.key._M_dataplus._M_p;
  }
  else {
    if (inputID != 0) {
      __assert_fail("inputID == 1 && \"invalid input ID\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                    ,0xa8,
                    "virtual void (anonymous namespace)::AckermannTask::provideValue(core::TaskInterface, uintptr_t, const core::KeyType &, const core::ValueType &)"
                   );
    }
    AckermannValue::AckermannValue((AckermannValue *)&local_38,value);
    (this->recursiveResultA).value = (int)local_38.key._M_dataplus._M_p;
    if ((this->m != 0) && (this->n != 0)) {
      local_18 = this->m + -1;
      local_14 = (int)local_38.key._M_dataplus._M_p;
      (anonymous_namespace)::AckermannKey::operator_cast_to_KeyType
                (&local_38,(AckermannKey *)&local_18);
      llbuild::core::TaskInterface::request(&local_48,&local_38,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_38.key._M_dataplus._M_p._4_4_,(int)local_38.key._M_dataplus._M_p) !=
          &local_38.key.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_38.key._M_dataplus._M_p._4_4_,
                                 (int)local_38.key._M_dataplus._M_p),
                        local_38.key.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

virtual void provideValue(core::TaskInterface ti, uintptr_t inputID,
                            const core::KeyType& key, const core::ValueType& value) override {
    if (inputID == 0) {
      recursiveResultA = value;

      // Request the second recursive result, if needed.
      if (m != 0 && n != 0) {
        ti.request(AckermannKey(m-1, recursiveResultA), 1);
      }
    } else {
      assert(inputID == 1 && "invalid input ID");
      recursiveResultB = value;
    }
  }